

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intM114.c
# Opt level: O2

int Inter_ManPerformOneStep(Inter_Man_t *p,int fUseBias,int fUseBackward,abctime nTimeNewOut)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  sat_solver *s;
  Sto_Man_t *__ptr;
  Sto_Man_t *pSVar3;
  abctime aVar4;
  abctime aVar5;
  Sto_Man_t *pCnf;
  Inta_Man_t *p_00;
  Aig_Man_t *pAVar6;
  long lVar7;
  uint uVar8;
  
  s = Inter_ManDeriveSatSolver
                (p->pInter,p->pCnfInter,p->pAigTrans,p->pCnfAig,p->pFrames,p->pCnfFrames,p->vVarsAB,
                 fUseBackward);
  if (s == (sat_solver *)0x0) {
    p->pInterNew = (Aig_Man_t *)0x0;
    uVar8 = 1;
  }
  else {
    if (nTimeNewOut != 0) {
      s->nRuntimeLimit = nTimeNewOut;
    }
    iVar2 = sat_solver_nvars(s);
    __ptr = (Sto_Man_t *)calloc((long)iVar2,4);
    pVVar1 = p->vVarsAB;
    iVar2 = pVVar1->nSize;
    for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      (&__ptr->nVars)[pVVar1->pArray[lVar7]] = 1;
    }
    pCnf = (Sto_Man_t *)0x0;
    pSVar3 = __ptr;
    if (fUseBias == 0) {
      pSVar3 = pCnf;
    }
    s->pGlobalVars = &pSVar3->nVars;
    aVar4 = Abc_Clock();
    iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->nConfLimit,0,0,0);
    p->nConfCur = (int)(s->stats).conflicts;
    aVar5 = Abc_Clock();
    p->timeSat = p->timeSat + (aVar5 - aVar4);
    s->pGlobalVars = (int *)0x0;
    free(__ptr);
    uVar8 = 0;
    if (iVar2 != 1) {
      if (iVar2 == -1) {
        pCnf = (Sto_Man_t *)sat_solver_store_release(s);
        uVar8 = 1;
      }
      else {
        uVar8 = 0xffffffff;
        pCnf = (Sto_Man_t *)0x0;
      }
    }
    sat_solver_delete(s);
    if (pCnf != (Sto_Man_t *)0x0) {
      aVar4 = Abc_Clock();
      p_00 = Inta_ManAlloc();
      pAVar6 = (Aig_Man_t *)Inta_ManInterpolate(p_00,pCnf,nTimeNewOut,p->vVarsAB,0);
      p->pInterNew = pAVar6;
      Inta_ManFree(p_00);
      aVar5 = Abc_Clock();
      p->timeInt = p->timeInt + (aVar5 - aVar4);
      Sto_ManFree(pCnf);
      uVar8 = uVar8 | -(uint)(p->pInterNew == (Aig_Man_t *)0x0);
    }
  }
  return uVar8;
}

Assistant:

int Inter_ManPerformOneStep( Inter_Man_t * p, int fUseBias, int fUseBackward, abctime nTimeNewOut )
{
    sat_solver * pSat;
    void * pSatCnf = NULL;
    Inta_Man_t * pManInterA; 
//    Intb_Man_t * pManInterB; 
    int * pGlobalVars;
    int status, RetValue;
    int i, Var;
    abctime clk;
//    assert( p->pInterNew == NULL );

    // derive the SAT solver
    pSat = Inter_ManDeriveSatSolver( p->pInter, p->pCnfInter, p->pAigTrans, p->pCnfAig, p->pFrames, p->pCnfFrames, p->vVarsAB, fUseBackward );
    if ( pSat == NULL )
    {
        p->pInterNew = NULL;
        return 1;
    }

    // set runtime limit
    if ( nTimeNewOut )
        sat_solver_set_runtime_limit( pSat, nTimeNewOut );

    // collect global variables
    pGlobalVars = ABC_CALLOC( int, sat_solver_nvars(pSat) );
    Vec_IntForEachEntry( p->vVarsAB, Var, i )
        pGlobalVars[Var] = 1;
    pSat->pGlobalVars = fUseBias? pGlobalVars : NULL;

    // solve the problem
clk = Abc_Clock();
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    p->nConfCur = pSat->stats.conflicts;
p->timeSat += Abc_Clock() - clk;

    pSat->pGlobalVars = NULL;
    ABC_FREE( pGlobalVars );
    if ( status == l_False )
    {
        pSatCnf = sat_solver_store_release( pSat );
        RetValue = 1;
    }
    else if ( status == l_True )
    {
        RetValue = 0;
    } 
    else
    {
        RetValue = -1;
    }
    sat_solver_delete( pSat );
    if ( pSatCnf == NULL )
        return RetValue;

    // create the resulting manager
clk = Abc_Clock();
/*
    if ( !fUseIp )
    {
        pManInterA = Inta_ManAlloc();
        p->pInterNew = Inta_ManInterpolate( pManInterA, pSatCnf, p->vVarsAB, 0 );
        Inta_ManFree( pManInterA );
    }
    else
    {
        Aig_Man_t * pInterNew2;
        int RetValue;

        pManInterA = Inta_ManAlloc();
        p->pInterNew = Inta_ManInterpolate( pManInterA, pSatCnf, p->vVarsAB, 0 );
//        Inter_ManVerifyInterpolant1( pManInterA, pSatCnf, p->pInterNew );
        Inta_ManFree( pManInterA );

        pManInterB = Intb_ManAlloc();
        pInterNew2 = Intb_ManInterpolate( pManInterB, pSatCnf, p->vVarsAB, 0 );
        Inter_ManVerifyInterpolant2( pManInterB, pSatCnf, pInterNew2 );
        Intb_ManFree( pManInterB );

        // check relationship
        RetValue = Inter_ManCheckEquivalence( pInterNew2, p->pInterNew );
        if ( RetValue )
            printf( "Equivalence \"Ip == Im\" holds\n" );
        else
        {
//            printf( "Equivalence \"Ip == Im\" does not hold\n" );
            RetValue = Inter_ManCheckContainment( pInterNew2, p->pInterNew );
            if ( RetValue )
                printf( "Containment \"Ip -> Im\" holds\n" );
            else
                printf( "Containment \"Ip -> Im\" does not hold\n" );

            RetValue = Inter_ManCheckContainment( p->pInterNew, pInterNew2 );
            if ( RetValue )
                printf( "Containment \"Im -> Ip\" holds\n" );
            else
                printf( "Containment \"Im -> Ip\" does not hold\n" );
        }

        Aig_ManStop( pInterNew2 );
    }
*/

    pManInterA = Inta_ManAlloc();
    p->pInterNew = (Aig_Man_t *)Inta_ManInterpolate( pManInterA, (Sto_Man_t *)pSatCnf, nTimeNewOut, p->vVarsAB, 0 );
    Inta_ManFree( pManInterA );

p->timeInt += Abc_Clock() - clk;
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    if ( p->pInterNew == NULL )
        RetValue = -1;
    return RetValue;
}